

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O1

void __thiscall QPDFJob::handleTransformations(QPDFJob *this,QPDF *pdf)

{
  string *name;
  element_type *peVar1;
  pointer pPVar2;
  int __val;
  undefined8 uVar3;
  bool bVar4;
  long *plVar5;
  runtime_error *prVar6;
  size_type *psVar7;
  QPDFPageObjectHelper *page_1;
  QPDFPageObjectHelper *pQVar8;
  pointer pPVar9;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *plVar10;
  QPDF *__args;
  pointer pQVar11;
  ulong i;
  QPDFPageObjectHelper *pQVar12;
  QPDFPageObjectHelper *ph;
  int iVar13;
  QPDFJob *this_00;
  string_view prefix;
  QPDFEmbeddedFileDocumentHelper efdh;
  QPDFObjectHandle page_labels;
  QPDFObjectHandle nums;
  QPDFPageDocumentHelper dh;
  undefined1 local_188 [32];
  QPDFPageObjectHelper *local_168;
  pointer local_160;
  QPDFJob *local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  QPDF *local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  QPDFObjectHandle local_108;
  _Any_data local_f8;
  code *local_e8;
  code *pcStack_e0;
  _Any_data local_d8;
  code *local_c8;
  code *pcStack_c0;
  QPDFPageDocumentHelper local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  QPDFPageDocumentHelper::QPDFPageDocumentHelper(&local_b0,pdf);
  if (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      remove_restrictions == true) {
    local_188._0_8_ = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<QPDFAcroFormDocumentHelper,std::allocator<QPDFAcroFormDocumentHelper>,QPDF&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_188 + 8),
               (QPDFAcroFormDocumentHelper **)local_188,
               (allocator<QPDFAcroFormDocumentHelper> *)&local_150,pdf);
    pQVar8 = (QPDFPageObjectHelper *)local_188._8_8_;
    uVar3 = local_188._0_8_;
    local_160 = (pointer)local_188._0_8_;
    local_188._8_8_ = (QPDFPageObjectHelper *)0x0;
    local_188._0_8_ = (QPDFPageObjectHelper *)0x0;
    QPDFAcroFormDocumentHelper::disableDigitalSignatures((QPDFAcroFormDocumentHelper *)uVar3);
  }
  else {
    local_160 = (pointer)0x0;
    pQVar8 = (QPDFPageObjectHelper *)0x0;
  }
  peVar1 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar1->externalize_inline_images != false) ||
     ((peVar1->optimize_images == true && (peVar1->keep_inline_images == false)))) {
    QPDFPageDocumentHelper::getAllPages
              ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)local_188,
               &local_b0);
    uVar3 = local_188._8_8_;
    for (pQVar12 = (QPDFPageObjectHelper *)local_188._0_8_; pQVar12 != (QPDFPageObjectHelper *)uVar3
        ; pQVar12 = pQVar12 + 1) {
      QPDFPageObjectHelper::externalizeInlineImages
                (pQVar12,((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->ii_min_bytes,false);
    }
    std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
              ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)local_188);
  }
  local_158 = this;
  local_130 = pdf;
  if (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      optimize_images == true) {
    local_168 = pQVar8;
    QPDFPageDocumentHelper::getAllPages
              ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)local_188,
               &local_b0);
    uVar3 = local_188._8_8_;
    if (local_188._0_8_ != local_188._8_8_) {
      iVar13 = 1;
      pQVar8 = (QPDFPageObjectHelper *)local_188._0_8_;
      do {
        local_c8 = (code *)0x0;
        pcStack_c0 = (code *)0x0;
        local_d8._M_unused._M_object = (void *)0x0;
        local_d8._8_8_ = 0;
        local_d8._M_unused._M_object = operator_new(0x18);
        *(QPDFJob **)local_d8._M_unused._0_8_ = local_158;
        *(int *)((long)local_d8._M_unused._0_8_ + 8) = iVar13;
        *(QPDF **)((long)local_d8._M_unused._0_8_ + 0x10) = local_130;
        pcStack_c0 = std::
                     _Function_handler<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob.cc:2205:17)>
                     ::_M_invoke;
        local_c8 = std::
                   _Function_handler<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob.cc:2205:17)>
                   ::_M_manager;
        QPDFPageObjectHelper::forEachImage
                  (pQVar8,true,
                   (function<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_d8);
        if (local_c8 != (code *)0x0) {
          (*local_c8)(&local_d8,&local_d8,__destroy_functor);
        }
        pQVar8 = pQVar8 + 1;
        iVar13 = iVar13 + 1;
      } while (pQVar8 != (QPDFPageObjectHelper *)uVar3);
    }
    std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
              ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)local_188);
    pQVar8 = local_168;
  }
  __args = local_130;
  this_00 = local_158;
  pQVar12 = pQVar8;
  if (((local_158->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      generate_appearances == true) {
    if (local_160 == (pointer)0x0) {
      local_188._0_8_ = (pointer)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<QPDFAcroFormDocumentHelper,std::allocator<QPDFAcroFormDocumentHelper>,QPDF&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_188 + 8),
                 (QPDFAcroFormDocumentHelper **)local_188,
                 (allocator<QPDFAcroFormDocumentHelper> *)&local_150,local_130);
      pQVar12 = (QPDFPageObjectHelper *)local_188._8_8_;
      local_160 = (pointer)local_188._0_8_;
      local_188._0_8_ = (QPDFPageObjectHelper *)0x0;
      local_188._8_8_ = (QPDFPageObjectHelper *)0x0;
      if (pQVar8 != (QPDFPageObjectHelper *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pQVar8);
      }
      if ((QPDFPageObjectHelper *)local_188._8_8_ != (QPDFPageObjectHelper *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_);
      }
    }
    QPDFAcroFormDocumentHelper::generateAppearancesIfNeeded((QPDFAcroFormDocumentHelper *)local_160)
    ;
  }
  peVar1 = (this_00->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1->flatten_annotations == true) {
    QPDFPageDocumentHelper::flattenAnnotations
              (&local_b0,peVar1->flatten_annotations_required,peVar1->flatten_annotations_forbidden)
    ;
  }
  if (((this_00->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      coalesce_contents == true) {
    QPDFPageDocumentHelper::getAllPages
              ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)local_188,
               &local_b0);
    uVar3 = local_188._8_8_;
    for (pQVar8 = (QPDFPageObjectHelper *)local_188._0_8_; pQVar8 != (QPDFPageObjectHelper *)uVar3;
        pQVar8 = pQVar8 + 1) {
      QPDFPageObjectHelper::coalesceContentStreams(pQVar8);
    }
    std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
              ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)local_188);
  }
  if (((this_00->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      flatten_rotation == true) {
    pQVar11 = local_160;
    if (local_160 == (pointer)0x0) {
      local_188._0_8_ = (pointer)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<QPDFAcroFormDocumentHelper,std::allocator<QPDFAcroFormDocumentHelper>,QPDF&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_188 + 8),
                 (QPDFAcroFormDocumentHelper **)local_188,
                 (allocator<QPDFAcroFormDocumentHelper> *)&local_150,__args);
      uVar3 = local_188._8_8_;
      pQVar11 = (pointer)local_188._0_8_;
      local_188._0_8_ = (QPDFPageObjectHelper *)0x0;
      local_188._8_8_ = (QPDFPageObjectHelper *)0x0;
      if (pQVar12 != (QPDFPageObjectHelper *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pQVar12);
      }
      pQVar12 = (QPDFPageObjectHelper *)uVar3;
      if ((QPDFPageObjectHelper *)local_188._8_8_ != (QPDFPageObjectHelper *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_);
      }
    }
    QPDFPageDocumentHelper::getAllPages
              ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)local_188,
               &local_b0);
    uVar3 = local_188._8_8_;
    for (pQVar8 = (QPDFPageObjectHelper *)local_188._0_8_; pQVar8 != (QPDFPageObjectHelper *)uVar3;
        pQVar8 = pQVar8 + 1) {
      QPDFPageObjectHelper::flattenRotation(pQVar8,(QPDFAcroFormDocumentHelper *)pQVar11);
    }
    std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
              ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)local_188);
    this_00 = local_158;
  }
  if (((this_00->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      remove_page_labels == true) {
    QPDF::getRoot((QPDF *)&local_150);
    local_188._0_8_ = (QPDFPageObjectHelper *)(local_188 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"/PageLabels","");
    QPDFObjectHandle::removeKey((QPDFObjectHandle *)&local_150,(string *)local_188);
    if ((QPDFPageObjectHelper *)local_188._0_8_ != (QPDFPageObjectHelper *)(local_188 + 0x10)) {
      operator_delete((void *)local_188._0_8_,(ulong)(local_188._16_8_ + 1));
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._M_string_length);
    }
  }
  peVar1 = (this_00->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_168 = pQVar12;
  if ((peVar1->page_label_specs).
      super__Vector_base<QPDFJob::PageLabelSpec,_std::allocator<QPDFJob::PageLabelSpec>_>._M_impl.
      super__Vector_impl_data._M_start !=
      *(pointer *)
       ((long)&(peVar1->page_label_specs).
               super__Vector_base<QPDFJob::PageLabelSpec,_std::allocator<QPDFJob::PageLabelSpec>_>.
               _M_impl.super__Vector_impl_data + 8)) {
    QPDFObjectHandle::newArray();
    QPDFPageDocumentHelper::getAllPages
              ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)local_188,
               &local_b0);
    i = ((long)(local_188._8_8_ - local_188._0_8_) >> 3) * 0x6db6db6db6db6db7;
    if ((i & 0xffffffff80000000) != 0) {
      QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(i);
    }
    std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
              ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)local_188);
    peVar1 = (this_00->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pPVar9 = (peVar1->page_label_specs).
             super__Vector_base<QPDFJob::PageLabelSpec,_std::allocator<QPDFJob::PageLabelSpec>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pPVar2 = *(pointer *)
              ((long)&(peVar1->page_label_specs).
                      super__Vector_base<QPDFJob::PageLabelSpec,_std::allocator<QPDFJob::PageLabelSpec>_>
                      ._M_impl.super__Vector_impl_data + 8);
    if (pPVar9 != pPVar2) {
      __val = (int)i;
      local_160 = (pointer)CONCAT44(local_160._4_4_,__val + 1);
      iVar13 = 0;
      do {
        if (pPVar9->first_page < 0) {
          pPVar9->first_page = pPVar9->first_page + (int)local_160;
        }
        if (iVar13 == 0) {
          if (pPVar9->first_page != 1) {
            prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error
                      (prVar6,"the first page label specification must start with page 1");
            goto LAB_0017e311;
          }
        }
        else if (pPVar9->first_page <= iVar13) {
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar6,"page label specifications must be in order by first page");
LAB_0017e311:
          __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        iVar13 = pPVar9->first_page;
        if (__val < iVar13) {
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::to_string(&local_70,pPVar9->first_page);
          std::operator+(&local_50,"page label spec: page ",&local_70);
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
          local_128._M_dataplus._M_p = (pointer)*plVar5;
          psVar7 = (size_type *)(plVar5 + 2);
          if ((size_type *)local_128._M_dataplus._M_p == psVar7) {
            local_128.field_2._M_allocated_capacity = *psVar7;
            local_128.field_2._8_8_ = plVar5[3];
            local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
          }
          else {
            local_128.field_2._M_allocated_capacity = *psVar7;
          }
          local_128._M_string_length = plVar5[1];
          *plVar5 = (long)psVar7;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          std::__cxx11::to_string(&local_90,__val);
          std::operator+(&local_150,&local_128,&local_90);
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_150);
          local_188._0_8_ = *plVar5;
          pQVar11 = (pointer)(plVar5 + 2);
          if ((pointer)local_188._0_8_ == pQVar11) {
            local_188._16_8_ = (pQVar11->super_QPDFObjectHelper)._vptr_QPDFObjectHelper;
            local_188._24_8_ = plVar5[3];
            local_188._0_8_ = (pointer)(local_188 + 0x10);
          }
          else {
            local_188._16_8_ = (pQVar11->super_QPDFObjectHelper)._vptr_QPDFObjectHelper;
          }
          local_188._8_8_ = plVar5[1];
          *plVar5 = (long)pQVar11;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          std::runtime_error::runtime_error(prVar6,(string *)local_188);
          __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        QPDFObjectHandle::newInteger((QPDFObjectHandle *)local_188,(long)pPVar9->first_page + -1);
        QPDFObjectHandle::appendItem(&local_108,(QPDFObjectHandle *)local_188);
        if ((QPDFPageObjectHelper *)local_188._8_8_ != (QPDFPageObjectHelper *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_);
        }
        prefix._M_len = (ulong)(uint)pPVar9->start_num;
        prefix._M_str = (char *)(pPVar9->prefix)._M_string_length;
        QPDFPageLabelDocumentHelper::pageLabelDict
                  ((qpdf_page_label_e)local_188,pPVar9->label_type,prefix);
        QPDFObjectHandle::appendItem(&local_108,(QPDFObjectHandle *)local_188);
        if ((QPDFPageObjectHelper *)local_188._8_8_ != (QPDFPageObjectHelper *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_);
        }
        pPVar9 = pPVar9 + 1;
      } while (pPVar9 != pPVar2);
    }
    QPDFObjectHandle::newDictionary();
    pQVar12 = local_168;
    pQVar8 = (QPDFPageObjectHelper *)(local_188 + 0x10);
    local_188._0_8_ = pQVar8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"/Nums","");
    __args = local_130;
    QPDFObjectHandle::replaceKey((QPDFObjectHandle *)&local_150,(string *)local_188,&local_108);
    this_00 = local_158;
    if ((QPDFPageObjectHelper *)local_188._0_8_ != pQVar8) {
      operator_delete((void *)local_188._0_8_,(ulong)(local_188._16_8_ + 1));
    }
    QPDF::getRoot((QPDF *)&local_128);
    local_188._0_8_ = pQVar8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"/PageLabels","");
    QPDFObjectHandle::replaceKey
              ((QPDFObjectHandle *)&local_128,(string *)local_188,(QPDFObjectHandle *)&local_150);
    if ((QPDFPageObjectHelper *)local_188._0_8_ != pQVar8) {
      operator_delete((void *)local_188._0_8_,(ulong)(local_188._16_8_ + 1));
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_string_length);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._M_string_length);
    }
    if (local_108.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_108.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
  }
  peVar1 = (this_00->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)*(undefined1 **)
          &(peVar1->attachments_to_remove).
           super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl._M_node.super__List_node_base != &peVar1->attachments_to_remove) {
    QPDFEmbeddedFileDocumentHelper::QPDFEmbeddedFileDocumentHelper
              ((QPDFEmbeddedFileDocumentHelper *)local_188,__args);
    peVar1 = (this_00->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    plVar5 = *(long **)&(peVar1->attachments_to_remove).
                        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl._M_node.super__List_node_base;
    plVar10 = &peVar1->attachments_to_remove;
    if ((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)plVar5 != plVar10) {
      do {
        name = (string *)(plVar5 + 2);
        bVar4 = QPDFEmbeddedFileDocumentHelper::removeEmbeddedFile
                          ((QPDFEmbeddedFileDocumentHelper *)local_188,name);
        if (!bVar4) {
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+(&local_128,"attachment ",name);
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_128);
          local_150._M_dataplus._M_p = (pointer)*plVar5;
          psVar7 = (size_type *)(plVar5 + 2);
          if ((size_type *)local_150._M_dataplus._M_p == psVar7) {
            local_150.field_2._M_allocated_capacity = *psVar7;
            local_150.field_2._8_8_ = plVar5[3];
            local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
          }
          else {
            local_150.field_2._M_allocated_capacity = *psVar7;
          }
          local_150._M_string_length = plVar5[1];
          *plVar5 = (long)psVar7;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          std::runtime_error::runtime_error(prVar6,(string *)&local_150);
          __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        local_f8._8_8_ = 0;
        pcStack_e0 = std::
                     _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob.cc:2283:29)>
                     ::_M_invoke;
        local_e8 = std::
                   _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob.cc:2283:29)>
                   ::_M_manager;
        local_f8._M_unused._M_object = name;
        doIfVerbose(local_158,
                    (function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                     *)&local_f8);
        if (local_e8 != (code *)0x0) {
          (*local_e8)(&local_f8,&local_f8,__destroy_functor);
        }
        plVar5 = (long *)*plVar5;
      } while ((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)plVar5 != plVar10);
    }
    QPDFEmbeddedFileDocumentHelper::~QPDFEmbeddedFileDocumentHelper
              ((QPDFEmbeddedFileDocumentHelper *)local_188);
    __args = local_130;
    pQVar12 = local_168;
    this_00 = local_158;
  }
  peVar1 = (this_00->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((list<QPDFJob::AddAttachment,_std::allocator<QPDFJob::AddAttachment>_> *)
      *(undefined1 **)
       &(peVar1->attachments_to_add).
        super__List_base<QPDFJob::AddAttachment,_std::allocator<QPDFJob::AddAttachment>_>._M_impl.
        _M_node.super__List_node_base != &peVar1->attachments_to_add) {
    addAttachments(this_00,__args);
  }
  peVar1 = (this_00->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((list<QPDFJob::CopyAttachmentFrom,_std::allocator<QPDFJob::CopyAttachmentFrom>_> *)
      *(undefined1 **)
       &(peVar1->attachments_to_copy).
        super__List_base<QPDFJob::CopyAttachmentFrom,_std::allocator<QPDFJob::CopyAttachmentFrom>_>.
        _M_impl._M_node.super__List_node_base != &peVar1->attachments_to_copy) {
    copyAttachments(this_00,__args);
  }
  if (pQVar12 != (QPDFPageObjectHelper *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pQVar12);
  }
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper(&local_b0);
  return;
}

Assistant:

void
QPDFJob::handleTransformations(QPDF& pdf)
{
    QPDFPageDocumentHelper dh(pdf);
    std::shared_ptr<QPDFAcroFormDocumentHelper> afdh;
    auto make_afdh = [&]() {
        if (!afdh.get()) {
            afdh = std::make_shared<QPDFAcroFormDocumentHelper>(pdf);
        }
    };
    if (m->remove_restrictions) {
        make_afdh();
        afdh->disableDigitalSignatures();
    }
    if (m->externalize_inline_images || (m->optimize_images && (!m->keep_inline_images))) {
        for (auto& ph: dh.getAllPages()) {
            ph.externalizeInlineImages(m->ii_min_bytes);
        }
    }
    if (m->optimize_images) {
        int pageno = 0;
        for (auto& ph: dh.getAllPages()) {
            ++pageno;
            ph.forEachImage(
                true,
                [this, pageno, &pdf](
                    QPDFObjectHandle& obj, QPDFObjectHandle& xobj_dict, std::string const& key) {
                    auto io = std::make_unique<ImageOptimizer>(
                        *this,
                        m->oi_min_width,
                        m->oi_min_height,
                        m->oi_min_area,
                        m->jpeg_quality,
                        obj);
                    if (io->evaluate("image " + key + " on page " + std::to_string(pageno))) {
                        QPDFObjectHandle new_image = pdf.newStream();
                        new_image.replaceDict(obj.getDict().shallowCopy());
                        new_image.replaceStreamData(
                            std::move(io),
                            QPDFObjectHandle::newName("/DCTDecode"),
                            QPDFObjectHandle::newNull());
                        xobj_dict.replaceKey(key, new_image);
                    }
                });
        }
    }
    if (m->generate_appearances) {
        make_afdh();
        afdh->generateAppearancesIfNeeded();
    }
    if (m->flatten_annotations) {
        dh.flattenAnnotations(m->flatten_annotations_required, m->flatten_annotations_forbidden);
    }
    if (m->coalesce_contents) {
        for (auto& page: dh.getAllPages()) {
            page.coalesceContentStreams();
        }
    }
    if (m->flatten_rotation) {
        make_afdh();
        for (auto& page: dh.getAllPages()) {
            page.flattenRotation(afdh.get());
        }
    }
    if (m->remove_page_labels) {
        pdf.getRoot().removeKey("/PageLabels");
    }
    if (!m->page_label_specs.empty()) {
        auto nums = QPDFObjectHandle::newArray();
        auto n_pages = QIntC::to_int(dh.getAllPages().size());
        int last_page_seen{0};
        for (auto& spec: m->page_label_specs) {
            if (spec.first_page < 0) {
                spec.first_page = n_pages + 1 + spec.first_page;
            }
            if (last_page_seen == 0) {
                if (spec.first_page != 1) {
                    throw std::runtime_error(
                        "the first page label specification must start with page 1");
                }
            } else if (spec.first_page <= last_page_seen) {
                throw std::runtime_error(
                    "page label specifications must be in order by first page");
            }
            if (spec.first_page > n_pages) {
                throw std::runtime_error(
                    "page label spec: page " + std::to_string(spec.first_page) +
                    " is more than the total number of pages (" + std::to_string(n_pages) + ")");
            }
            last_page_seen = spec.first_page;
            nums.appendItem(QPDFObjectHandle::newInteger(spec.first_page - 1));
            nums.appendItem(
                QPDFPageLabelDocumentHelper::pageLabelDict(
                    spec.label_type, spec.start_num, spec.prefix));
        }
        auto page_labels = QPDFObjectHandle::newDictionary();
        page_labels.replaceKey("/Nums", nums);
        pdf.getRoot().replaceKey("/PageLabels", page_labels);
    }
    if (!m->attachments_to_remove.empty()) {
        QPDFEmbeddedFileDocumentHelper efdh(pdf);
        for (auto const& key: m->attachments_to_remove) {
            if (efdh.removeEmbeddedFile(key)) {
                doIfVerbose([&](Pipeline& v, std::string const& prefix) {
                    v << prefix << ": removed attachment " << key << "\n";
                });
            } else {
                throw std::runtime_error("attachment " + key + " not found");
            }
        }
    }
    if (!m->attachments_to_add.empty()) {
        addAttachments(pdf);
    }
    if (!m->attachments_to_copy.empty()) {
        copyAttachments(pdf);
    }
}